

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mouse.cpp
# Opt level: O0

void __thiscall Mouse::OnWheelDown(Mouse *this,int x,int y)

{
  Event local_28;
  int local_18;
  int local_14;
  int y_local;
  int x_local;
  Mouse *this_local;
  
  local_18 = y;
  local_14 = x;
  _y_local = this;
  Event::Event(&local_28,WheelDown,this);
  std::queue<Mouse::Event,_std::deque<Mouse::Event,_std::allocator<Mouse::Event>_>_>::push
            (&this->buffer,&local_28);
  TrimBuffer(this);
  return;
}

Assistant:

void Mouse::OnWheelDown( int x,int y )
{
	buffer.push( Mouse::Event( Mouse::Event::Type::WheelDown,*this ) );
	TrimBuffer();
}